

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXCobraConnection.cpp
# Opt level: O0

bool __thiscall ix::CobraConnection::handleHandshakeResponse(CobraConnection *this,Value *pdu)

{
  bool bVar1;
  Value *pVVar2;
  string local_c8;
  undefined1 local_a8 [8];
  Value nonce;
  Value data;
  undefined1 local_48 [8];
  Value body;
  Value *pdu_local;
  CobraConnection *this_local;
  
  body.limit_ = (ptrdiff_t)pdu;
  bVar1 = Json::Value::isMember(pdu,"body");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)body.limit_,"body");
    Json::Value::Value((Value *)local_48,pVVar2);
    bVar1 = Json::Value::isMember((Value *)local_48,"data");
    if (bVar1) {
      pVVar2 = Json::Value::operator[]((Value *)local_48,"data");
      Json::Value::Value((Value *)&nonce.limit_,pVVar2);
      bVar1 = Json::Value::isMember((Value *)&nonce.limit_,"nonce");
      if (bVar1) {
        pVVar2 = Json::Value::operator[]((Value *)&nonce.limit_,"nonce");
        Json::Value::Value((Value *)local_a8,pVVar2);
        bVar1 = Json::Value::isString((Value *)local_a8);
        if (bVar1) {
          Json::Value::asString_abi_cxx11_(&local_c8,(Value *)local_a8);
          this_local._7_1_ = sendAuthMessage(this,&local_c8);
          ::std::__cxx11::string::~string((string *)&local_c8);
        }
        else {
          this_local._7_1_ = false;
        }
        Json::Value::~Value((Value *)local_a8);
      }
      else {
        this_local._7_1_ = false;
      }
      Json::Value::~Value((Value *)&nonce.limit_);
    }
    else {
      this_local._7_1_ = false;
    }
    Json::Value::~Value((Value *)local_48);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CobraConnection::handleHandshakeResponse(const Json::Value& pdu)
    {
        if (!pdu.isMember("body")) return false;
        Json::Value body = pdu["body"];

        if (!body.isMember("data")) return false;
        Json::Value data = body["data"];

        if (!data.isMember("nonce")) return false;
        Json::Value nonce = data["nonce"];

        if (!nonce.isString()) return false;

        return sendAuthMessage(nonce.asString());
    }